

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFileWriter.cpp
# Opt level: O0

int __thiscall AudioFileWriter::close(AudioFileWriter *this,int __fd)

{
  int iVar1;
  undefined1 local_48 [4];
  quint32 fileSize;
  uchar headerBuffer [44];
  AudioFileWriter *this_local;
  
  if ((this->waveMode & 1U) != 0) {
    iVar1 = QFile::size();
    memcpy(local_48,"RIFF",0x2c);
    qToLittleEndian<unsigned_int>(iVar1 - 8,&fileSize);
    qToLittleEndian<unsigned_int>(iVar1 - 0x2c,headerBuffer + 0x20);
    qToLittleEndian<unsigned_int>(this->sampleRate,headerBuffer + 0x10);
    qToLittleEndian<unsigned_int>(this->sampleRate << 2,headerBuffer + 0x14);
    QFileDevice::seek((longlong)&this->file);
    QIODevice::write((char *)&this->file,(longlong)local_48);
  }
  iVar1 = QFileDevice::close();
  return iVar1;
}

Assistant:

void AudioFileWriter::close() {
	if (waveMode) {
		uchar headerBuffer[WAVE_HEADER_LENGTH];
		quint32 fileSize = (quint32)file.size();
		memcpy(headerBuffer, WAVE_HEADER, WAVE_HEADER_LENGTH);
		qToLittleEndian(fileSize - RIFF_HEADER_LENGTH, headerBuffer + RIFF_PAYLOAD_SIZE_OFFSET);
		qToLittleEndian(fileSize - WAVE_HEADER_LENGTH, headerBuffer + WAVE_DATA_SIZE_OFFSET);
		qToLittleEndian(sampleRate, headerBuffer + WAVE_SAMPLE_RATE_OFFSET);
		qToLittleEndian(sampleRate * FRAME_SIZE, headerBuffer + WAVE_BYTE_RATE_OFFSET);
		file.seek(0);
		file.write((char *)headerBuffer, WAVE_HEADER_LENGTH);
	}
	file.close();
}